

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serial_arena.h
# Opt level: O2

void * __thiscall
google::protobuf::internal::SerialArena::
AllocateAligned<(google::protobuf::internal::AllocationClient)0>(SerialArena *this,size_t n)

{
  bool bVar1;
  char *failure_msg;
  int line;
  void *ptr;
  
  if ((n & 7) == 0) {
    ptr = (this->ptr_)._M_b._M_p;
    failure_msg = absl::lts_20250127::log_internal::Check_GEImpl<char*,char*>
                            (&this->limit_,(char **)&ptr,"limit_ >= ptr()");
    if (failure_msg == (Nullable<const_char_*>)0x0) {
      bVar1 = MaybeAllocateAligned(this,n,&ptr);
      if (!bVar1) {
        ptr = AllocateAlignedFallback(this,n);
      }
      return ptr;
    }
    line = 0x76;
  }
  else {
    failure_msg = "internal::ArenaAlignDefault::IsAligned(n)";
    line = 0x75;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&ptr,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/serial_arena.h"
             ,line,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&ptr);
}

Assistant:

void* AllocateAligned(size_t n) {
    ABSL_DCHECK(internal::ArenaAlignDefault::IsAligned(n));
    ABSL_DCHECK_GE(limit_, ptr());

    if (alloc_client == AllocationClient::kArray) {
      if (void* res = TryAllocateFromCachedBlock(n)) {
        return res;
      }
    }

    void* ptr;
    if (ABSL_PREDICT_TRUE(MaybeAllocateAligned(n, &ptr))) {
      return ptr;
    }
    return AllocateAlignedFallback(n);
  }